

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRow.cpp
# Opt level: O0

bool __thiscall HEkkDualRow::chooseFinalWorkGroupQuad(HEkkDualRow *this)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  reference pvVar7;
  size_type sVar8;
  pair<int,_double> *in_RDI;
  HighsInt num_var_1;
  HighsInt num_var;
  double dual;
  double value;
  HighsInt iCol;
  HighsInt i;
  double remainTheta;
  double prev_selectTheta;
  double prev_remainTheta;
  HighsInt prev_workCount;
  double totalDelta;
  double selectTheta;
  double totalChange;
  HighsInt fullCount;
  double Td;
  value_type_conflict2 *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined1 force;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff90;
  double *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa4;
  HighsOptions *in_stack_ffffffffffffffa8;
  HighsOptions *pHVar9;
  HighsInt workCount;
  HighsOptions *options;
  int local_40;
  HighsOptions *local_30;
  double local_28;
  
  dVar1 = *(double *)(*(long *)(*(long *)in_RDI + 8) + 0x120);
  iVar3 = *(int *)&in_RDI[0xc].field_0x4;
  *(undefined4 *)&in_RDI[0xc].field_0x4 = 0;
  local_28 = 1e-12;
  local_30 = (HighsOptions *)in_RDI[0xb].second;
  dVar2 = in_RDI[10].second;
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x79fe80);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_RDI,in_stack_ffffffffffffff78);
  local_40 = *(int *)&in_RDI[0xc].field_0x4;
  options = (HighsOptions *)0x54b249ad2594c37d;
  while ((double)local_30 < 1e+18) {
    in_stack_ffffffffffffffa8 = (HighsOptions *)0x54b249ad2594c37d;
    pHVar9 = local_30;
    for (in_stack_ffffffffffffffa4 = *(int *)&in_RDI[0xc].field_0x4;
        in_stack_ffffffffffffffa4 < iVar3; in_stack_ffffffffffffffa4 = in_stack_ffffffffffffffa4 + 1
        ) {
      pvVar7 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
               operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           *)&in_RDI[0xc].second,(long)in_stack_ffffffffffffffa4);
      iVar4 = pvVar7->first;
      pvVar7 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
               operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           *)&in_RDI[0xc].second,(long)in_stack_ffffffffffffffa4);
      in_stack_ffffffffffffff98 = (double *)pvVar7->second;
      in_stack_ffffffffffffff90 =
           (vector<int,_std::allocator<int>_> *)
           ((double)(int)*(char *)((long)in_RDI[1].second + (long)iVar4) *
           *(double *)(*(pointer *)(in_RDI + 2) + (long)iVar4 * 2));
      if ((double)local_30 * (double)in_stack_ffffffffffffff98 < (double)in_stack_ffffffffffffff90)
      {
        if ((double)in_stack_ffffffffffffff90 + dVar1 <
            (double)in_stack_ffffffffffffffa8 * (double)in_stack_ffffffffffffff98) {
          in_stack_ffffffffffffffa8 =
               (HighsOptions *)
               (((double)in_stack_ffffffffffffff90 + dVar1) / (double)in_stack_ffffffffffffff98);
        }
      }
      else {
        iVar5 = *(int *)&in_RDI[0xc].field_0x4;
        *(int *)&in_RDI[0xc].field_0x4 = iVar5 + 1;
        pvVar7 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                 operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                             *)&in_RDI[0xc].second,(long)iVar5);
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                  ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   &in_RDI[0xc].second,(long)in_stack_ffffffffffffffa4);
        std::swap<int,double>(in_RDI,pvVar7);
        local_28 = (double)in_stack_ffffffffffffff98 *
                   *(double *)((pointer)in_RDI[2].second + (long)iVar4 * 2) + local_28;
      }
    }
    std::vector<int,_std::allocator<int>_>::push_back
              (in_stack_ffffffffffffff90,
               (value_type_conflict2 *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
              );
    if ((*(int *)&in_RDI[0xc].field_0x4 == local_40) &&
       ((double)pHVar9 == (double)in_stack_ffffffffffffffa8)) {
      if (((double)options == (double)in_stack_ffffffffffffffa8) &&
         (!NAN((double)options) && !NAN((double)in_stack_ffffffffffffffa8))) {
        debugDualChuzcFailQuad0
                  (options,(HighsInt)((ulong)pHVar9 >> 0x20),
                   (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98,
                   (double)in_stack_ffffffffffffff90,
                   (double)CONCAT44(*(int *)(*(long *)in_RDI + 0x2198) +
                                    *(int *)(*(long *)in_RDI + 0x219c),in_stack_ffffffffffffff88),
                   SUB81((ulong)in_RDI >> 0x38,0));
        return false;
      }
    }
    local_40 = *(int *)&in_RDI[0xc].field_0x4;
    local_30 = in_stack_ffffffffffffffa8;
    options = in_stack_ffffffffffffffa8;
    if ((ABS(dVar2) <= local_28) || (*(int *)&in_RDI[0xc].field_0x4 == iVar3)) break;
  }
  workCount = (HighsInt)((ulong)local_30 >> 0x20);
  force = (undefined1)((uint)in_stack_ffffffffffffff8c >> 0x18);
  sVar8 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe));
  bVar6 = 1 < (int)sVar8;
  if (!bVar6) {
    debugDualChuzcFailQuad1
              (options,workCount,
               (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
               in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98,
               (double)in_stack_ffffffffffffff90,(bool)force);
  }
  return bVar6;
}

Assistant:

bool HEkkDualRow::chooseFinalWorkGroupQuad() {
  const double Td = ekk_instance_.options_->dual_feasibility_tolerance;
  HighsInt fullCount = workCount;
  workCount = 0;
  double totalChange = kInitialTotalChange;
  double selectTheta = workTheta;
  const double totalDelta = fabs(workDelta);
  workGroup.clear();
  workGroup.push_back(0);
  HighsInt prev_workCount = workCount;
  double prev_remainTheta = kInitialRemainTheta;
  double prev_selectTheta = selectTheta;

  while (selectTheta < kMaxSelectTheta) {
    double remainTheta = kInitialRemainTheta;
    for (HighsInt i = workCount; i < fullCount; i++) {
      HighsInt iCol = workData[i].first;
      double value = workData[i].second;
      double dual = workMove[iCol] * workDual[iCol];
      // Tight satisfy
      if (dual <= selectTheta * value) {
        swap(workData[workCount++], workData[i]);
        totalChange += value * (workRange[iCol]);
      } else if (dual + Td < remainTheta * value) {
        remainTheta = (dual + Td) / value;
      }
    }
    workGroup.push_back(workCount);

    // Update selectTheta with the value of remainTheta;
    selectTheta = remainTheta;
    // Check for no change in this loop - to prevent infinite loop
    if ((workCount == prev_workCount) && (prev_selectTheta == selectTheta) &&
        (prev_remainTheta == remainTheta)) {
      HighsInt num_var =
          ekk_instance_.lp_.num_col_ + ekk_instance_.lp_.num_row_;
      debugDualChuzcFailQuad0(*ekk_instance_.options_, workCount, workData,
                              num_var, workDual, selectTheta, remainTheta,
                              true);
      return false;
    }
    // Record the initial values of workCount, remainTheta and selectTheta for
    // the next pass through the loop - to check for infinite loop condition
    prev_workCount = workCount;
    prev_remainTheta = remainTheta;
    prev_selectTheta = selectTheta;
    if (totalChange >= totalDelta || workCount == fullCount) break;
  }
  // Check that at least one group has been identified
  if ((HighsInt)workGroup.size() <= 1) {
    HighsInt num_var = ekk_instance_.lp_.num_col_ + ekk_instance_.lp_.num_row_;
    debugDualChuzcFailQuad1(*ekk_instance_.options_, workCount, workData,
                            num_var, workDual, selectTheta, true);
    return false;
  }
  return true;
}